

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::Tokenizer::NextWithComments
          (Tokenizer *this,string *prev_trailing_comments,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detached_comments,string *next_leading_comments)

{
  undefined1 uVar1;
  bool bVar2;
  NextCommentStatus NVar3;
  allocator local_81;
  CommentCollector collector;
  string local_40;
  
  collector.comment_buffer_._M_dataplus._M_p = (pointer)&collector.comment_buffer_.field_2;
  collector.comment_buffer_._M_string_length = 0;
  collector.comment_buffer_.field_2._M_local_buf[0] = '\0';
  collector.has_comment_ = false;
  collector.is_line_comment_ = false;
  collector.can_attach_to_prev_ = true;
  if (prev_trailing_comments != (string *)0x0) {
    prev_trailing_comments->_M_string_length = 0;
    *(prev_trailing_comments->_M_dataplus)._M_p = '\0';
  }
  collector.prev_trailing_comments_ = prev_trailing_comments;
  collector.detached_comments_ = detached_comments;
  collector.next_leading_comments_ = next_leading_comments;
  if (detached_comments !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(detached_comments);
  }
  if (next_leading_comments != (string *)0x0) {
    next_leading_comments->_M_string_length = 0;
    *(next_leading_comments->_M_dataplus)._M_p = '\0';
  }
  if ((this->current_).type != TYPE_START) {
    ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::WhitespaceNoNewline>(this);
    NVar3 = TryConsumeCommentStart(this);
    uVar1 = (*(code *)(&DAT_003a22d0 + *(int *)(&DAT_003a22d0 + (ulong)NVar3 * 4)))();
    return (bool)uVar1;
  }
  bVar2 = TryConsume(this,-0x11);
  if (bVar2) {
    bVar2 = TryConsume(this,-0x45);
    if (bVar2) {
      bVar2 = TryConsume(this,-0x41);
      if (bVar2) goto LAB_0031fe51;
    }
    std::__cxx11::string::string
              ((string *)&local_40,
               "Proto file starts with 0xEF but not UTF-8 BOM. Only UTF-8 is accepted for proto file."
               ,&local_81);
    AddError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    anon_unknown_4::CommentCollector::~CommentCollector(&collector);
    return false;
  }
LAB_0031fe51:
  collector.can_attach_to_prev_ = false;
  ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::WhitespaceNoNewline>(this);
  NVar3 = TryConsumeCommentStart(this);
  uVar1 = (*(code *)(&DAT_003a22e0 + *(int *)(&DAT_003a22e0 + (ulong)NVar3 * 4)))();
  return (bool)uVar1;
}

Assistant:

bool Tokenizer::NextWithComments(string* prev_trailing_comments,
                                 std::vector<string>* detached_comments,
                                 string* next_leading_comments) {
  CommentCollector collector(prev_trailing_comments, detached_comments,
                             next_leading_comments);

  if (current_.type == TYPE_START) {
    // Ignore unicode byte order mark(BOM) if it appears at the file
    // beginning. Only UTF-8 BOM (0xEF 0xBB 0xBF) is accepted.
    if (TryConsume((char)0xEF)) {
      if (!TryConsume((char)0xBB) || !TryConsume((char)0xBF)) {
        AddError("Proto file starts with 0xEF but not UTF-8 BOM. "
                 "Only UTF-8 is accepted for proto file.");
        return false;
      }
    }
    collector.DetachFromPrev();
  } else {
    // A comment appearing on the same line must be attached to the previous
    // declaration.
    ConsumeZeroOrMore<WhitespaceNoNewline>();
    switch (TryConsumeCommentStart()) {
      case LINE_COMMENT:
        ConsumeLineComment(collector.GetBufferForLineComment());

        // Don't allow comments on subsequent lines to be attached to a trailing
        // comment.
        collector.Flush();
        break;
      case BLOCK_COMMENT:
        ConsumeBlockComment(collector.GetBufferForBlockComment());

        ConsumeZeroOrMore<WhitespaceNoNewline>();
        if (!TryConsume('\n')) {
          // Oops, the next token is on the same line.  If we recorded a comment
          // we really have no idea which token it should be attached to.
          collector.ClearBuffer();
          return Next();
        }

        // Don't allow comments on subsequent lines to be attached to a trailing
        // comment.
        collector.Flush();
        break;
      case SLASH_NOT_COMMENT:
        return true;
      case NO_COMMENT:
        if (!TryConsume('\n')) {
          // The next token is on the same line.  There are no comments.
          return Next();
        }
        break;
    }
  }

  // OK, we are now on the line *after* the previous token.
  while (true) {
    ConsumeZeroOrMore<WhitespaceNoNewline>();

    switch (TryConsumeCommentStart()) {
      case LINE_COMMENT:
        ConsumeLineComment(collector.GetBufferForLineComment());
        break;
      case BLOCK_COMMENT:
        ConsumeBlockComment(collector.GetBufferForBlockComment());

        // Consume the rest of the line so that we don't interpret it as a
        // blank line the next time around the loop.
        ConsumeZeroOrMore<WhitespaceNoNewline>();
        TryConsume('\n');
        break;
      case SLASH_NOT_COMMENT:
        return true;
      case NO_COMMENT:
        if (TryConsume('\n')) {
          // Completely blank line.
          collector.Flush();
          collector.DetachFromPrev();
        } else {
          bool result = Next();
          if (!result ||
              current_.text == "}" ||
              current_.text == "]" ||
              current_.text == ")") {
            // It looks like we're at the end of a scope.  In this case it
            // makes no sense to attach a comment to the following token.
            collector.Flush();
          }
          return result;
        }
        break;
    }
  }
}